

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# riotMap.c
# Opt level: O1

Path * pathSolve(Path *param_1,int *param_2,ulong param_3,int param_4)

{
  byte bVar1;
  char cVar2;
  uint uVar3;
  TileNode *pTVar4;
  ulong uVar5;
  int iVar6;
  TileNode *pTVar7;
  ulong uVar8;
  Path *pPVar9;
  int iVar10;
  uint uVar11;
  long lVar12;
  undefined8 *puVar13;
  TileNode *pTVar14;
  long lVar15;
  undefined8 *puVar16;
  int iVar17;
  int iVar18;
  Path *pPVar19;
  byte bVar20;
  undefined8 auStack_a48 [158];
  byte local_551;
  long local_550;
  Path *local_548;
  ulong local_540;
  long local_538;
  ulong local_530;
  Path *local_528;
  undefined1 local_520 [1264];
  
  bVar20 = 0;
  local_530 = 0;
  local_548 = param_1;
  do {
    iVar17 = param_4 + -1;
    iVar6 = iVar17 >> 0x1f;
    iVar18 = iVar17 / 0x48 + iVar6;
    iVar10 = iVar18 - iVar6;
    uVar11 = param_4 + iVar10 * -0x48;
    iVar6 = (iVar18 - iVar6) + 1;
    iVar18 = uVar11 + iVar6 * 0x48;
    lVar15 = (long)(int)param_3;
    local_540 = param_3;
    if (*param_2 != iVar18) {
      uVar5 = 0;
      do {
        uVar8 = uVar5;
        if (uVar8 == 0x47f) break;
        uVar5 = uVar8 + 1;
      } while (param_2[uVar8 + 1] != iVar18);
      if ((0x47e < uVar8) &&
         ((bVar1 = (&stack0x00000054)[(long)(int)uVar11 + (long)iVar6 * 0x49], bVar1 - 0x23 < 4 ||
          (bVar1 == 0x2e)))) {
        param_2[lVar15] = param_4;
        local_550 = lVar15;
        pTVar7 = (TileNode *)malloc(0x10);
        pPVar19 = local_548;
        pTVar7->next = (TileNode *)0x0;
        pTVar7->location = param_4;
        pTVar7->type = bVar1;
        uVar3 = local_548->count;
        pPVar9 = local_548;
        if (uVar3 != 0) {
          pTVar4 = local_548->first;
          do {
            pTVar14 = pTVar4;
            pTVar4 = pTVar14->next;
          } while (pTVar4 != (TileNode *)0x0);
          pPVar9 = (Path *)&pTVar14->next;
        }
        pPVar9->first = pTVar7;
        local_548->count = uVar3 + 1;
        iVar18 = (int)local_540;
        puVar13 = (undefined8 *)&stack0x00000008;
        puVar16 = auStack_a48;
        for (lVar15 = 0x9e; lVar15 != 0; lVar15 = lVar15 + -1) {
          *puVar16 = *puVar13;
          puVar13 = puVar13 + (ulong)bVar20 * -2 + 1;
          puVar16 = puVar16 + (ulong)bVar20 * -2 + 1;
        }
        pathSolve(pPVar19,param_2,iVar18 + 1);
        lVar15 = local_550;
      }
    }
    iVar18 = param_4 + 1;
    lVar12 = (long)iVar10;
    if (*param_2 != iVar18) {
      uVar5 = 0;
      do {
        uVar8 = uVar5;
        if (uVar8 == 0x47f) break;
        uVar5 = uVar8 + 1;
      } while (param_2[uVar8 + 1] != iVar18);
      if (0x47e < uVar8) {
        bVar1 = (&stack0x00000055)[(long)(int)uVar11 + lVar12 * 0x49];
        if ((bVar1 - 0x23 < 4) || (bVar1 == 0x2e)) {
          param_2[lVar15] = param_4;
          local_551 = bVar1;
          local_550 = lVar15;
          local_538 = lVar12;
          pTVar7 = (TileNode *)malloc(0x10);
          pPVar19 = local_548;
          pTVar7->next = (TileNode *)0x0;
          pTVar7->location = param_4;
          pTVar7->type = local_551;
          uVar3 = local_548->count;
          pPVar9 = local_548;
          if (uVar3 != 0) {
            pTVar4 = local_548->first;
            do {
              pTVar14 = pTVar4;
              pTVar4 = pTVar14->next;
            } while (pTVar4 != (TileNode *)0x0);
            pPVar9 = (Path *)&pTVar14->next;
          }
          pPVar9->first = pTVar7;
          local_548->count = uVar3 + 1;
          iVar6 = (int)local_540;
          puVar13 = (undefined8 *)&stack0x00000008;
          puVar16 = auStack_a48;
          for (lVar15 = 0x9e; lVar15 != 0; lVar15 = lVar15 + -1) {
            *puVar16 = *puVar13;
            puVar13 = puVar13 + (ulong)bVar20 * -2 + 1;
            puVar16 = puVar16 + (ulong)bVar20 * -2 + 1;
          }
          pathSolve(pPVar19,param_2,iVar6 + 1,iVar18);
          lVar12 = local_538;
          lVar15 = local_550;
        }
      }
    }
    pPVar19 = local_548;
    if (0x48 < param_4) {
      iVar18 = uVar11 + (iVar10 + -1) * 0x48;
      if (*param_2 != iVar18) {
        uVar5 = 0;
        do {
          uVar8 = uVar5;
          if (uVar8 == 0x47f) break;
          uVar5 = uVar8 + 1;
        } while (param_2[uVar8 + 1] != iVar18);
        if ((0x47e < uVar8) &&
           ((bVar1 = (&stack0x00000054)[(long)(int)uVar11 + (long)(iVar10 + -1) * 0x49],
            bVar1 - 0x23 < 4 || (bVar1 == 0x2e)))) {
          param_2[lVar15] = param_4;
          local_550 = lVar15;
          local_538 = lVar12;
          pTVar7 = (TileNode *)malloc(0x10);
          pTVar7->next = (TileNode *)0x0;
          pTVar7->location = param_4;
          pTVar7->type = bVar1;
          uVar3 = pPVar19->count;
          pPVar9 = pPVar19;
          if (uVar3 != 0) {
            pTVar4 = pPVar19->first;
            do {
              pTVar14 = pTVar4;
              pTVar4 = pTVar14->next;
            } while (pTVar4 != (TileNode *)0x0);
            pPVar9 = (Path *)&pTVar14->next;
          }
          pPVar9->first = pTVar7;
          pPVar19->count = uVar3 + 1;
          iVar18 = (int)local_540;
          puVar13 = (undefined8 *)&stack0x00000008;
          puVar16 = auStack_a48;
          for (lVar15 = 0x9e; lVar15 != 0; lVar15 = lVar15 + -1) {
            *puVar16 = *puVar13;
            puVar13 = puVar13 + (ulong)bVar20 * -2 + 1;
            puVar16 = puVar16 + (ulong)bVar20 * -2 + 1;
          }
          pathSolve(pPVar19,param_2,iVar18 + 1,param_4 + -0x48);
          lVar12 = local_538;
          lVar15 = local_550;
        }
      }
    }
    if (((int)uVar11 < 1) || (*param_2 == iVar17)) {
LAB_00102da3:
      if ((local_530 & 1) != 0) {
        pPVar19 = local_528;
      }
      return pPVar19;
    }
    uVar5 = 0;
    do {
      uVar8 = uVar5;
      if (uVar8 == 0x47f) break;
      uVar5 = uVar8 + 1;
    } while (param_2[uVar8 + 1] != iVar17);
    if (uVar8 < 0x47f) goto LAB_00102da3;
    if ((3 < (byte)(&stack0x00000054)[(long)(int)(uVar11 - 1) + lVar12 * 0x49] - 0x23) &&
       ((&stack0x00000054)[(long)(int)(uVar11 - 1) + lVar12 * 0x49] != 0x2e)) goto LAB_00102da3;
    param_2[lVar15] = param_4;
    cVar2 = (&stack0x00000054)[(ulong)uVar11 + lVar12 * 0x49];
    pTVar7 = (TileNode *)malloc(0x10);
    pTVar7->next = (TileNode *)0x0;
    pTVar7->location = param_4;
    pTVar7->type = cVar2;
    uVar11 = pPVar19->count;
    pPVar9 = pPVar19;
    if (uVar11 != 0) {
      pTVar4 = pPVar19->first;
      do {
        pTVar14 = pTVar4;
        pTVar4 = pTVar14->next;
      } while (pTVar4 != (TileNode *)0x0);
      pPVar9 = (Path *)&pTVar14->next;
    }
    pPVar9->first = pTVar7;
    pPVar19->count = uVar11 + 1;
    param_3 = (ulong)((int)local_540 + 1);
    memcpy(local_520,&stack0x00000008,0x4f0);
    memcpy(&stack0x00000008,local_520,0x4f0);
    if ((local_530 & 1) == 0) {
      local_528 = pPVar19;
    }
    local_530 = CONCAT71((int7)((ulong)local_528 >> 8),1);
    param_4 = iVar17;
  } while( true );
}

Assistant:

struct Path *pathSolve(struct Map map, struct Path *path, int prevChecked[],
    int count, int currentPosition) {
    int i, j, nextPosition, beingChecked;

    i = (currentPosition - 1) / MAP_COLS;
    j = currentPosition - (MAP_COLS * i);

    beingChecked = ((i + 1) * MAP_COLS) + j;

    if (!beenChecked(prevChecked, beingChecked) &&
        isPathCharacter(map.overlay[i + 1][j])) {
        nextPosition = currentPosition + MAP_COLS;
        prevChecked[count] = currentPosition;
        pushToPath(createTileNode(currentPosition, map.overlay[i + 1][j]),
            path);
        pathSolve(map, path, prevChecked, count + 1, nextPosition);
    }

    beingChecked = (i * MAP_COLS) + (j + 1);

    if (!beenChecked(prevChecked, beingChecked) &&
        isPathCharacter(map.overlay[i][j + 1])) {
        nextPosition = currentPosition + 1;
        prevChecked[count] = currentPosition;
        pushToPath(createTileNode(currentPosition, map.overlay[i][j + 1]),
            path);
        pathSolve(map, path, prevChecked, count + 1, nextPosition);
    }

    beingChecked = ((i - 1) * MAP_COLS) + j;

    if (i > 0) {
        if (!beenChecked(prevChecked, beingChecked) &&
            isPathCharacter(map.overlay[i - 1][j])) {
            nextPosition = currentPosition - MAP_COLS;
            prevChecked[count] = currentPosition;
            pushToPath(createTileNode(currentPosition, map.overlay[i - 1][j]),
                path);
            pathSolve(map, path, prevChecked, count + 1, nextPosition);
        }
    }

    beingChecked = (i * MAP_COLS) + (j - 1);

    if (j > 0) {
        if (!beenChecked(prevChecked, beingChecked) &&
            isPathCharacter(map.overlay[i][j - 1])) {
            nextPosition = currentPosition - 1;
            prevChecked[count] = currentPosition;
            pushToPath(createTileNode(currentPosition, map.overlay[i][j]),
                path);
            pathSolve(map, path, prevChecked, count + 1, nextPosition);
        }
    }

    return path;
}